

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O1

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write_segment<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (writer_base<cppwinrt::writer> *this,string_view *value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_1,
          basic_string_view<char,_std::char_traits<char>_> *rest_2,
          basic_string_view<char,_std::char_traits<char>_> *rest_3,
          basic_string_view<char,_std::char_traits<char>_> *rest_4)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  ulong uVar4;
  string_view local_40;
  
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(value,"^%@",0,3);
  if (sVar3 == 0xffffffffffffffff) {
    __assert_fail("offset != std::string_view::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x125,
                  "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = std::basic_string<char>, Rest = <std::basic_string<char>, std::basic_string<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>>]"
                 );
  }
  uVar4 = value->_M_len;
  if (sVar3 <= value->_M_len) {
    uVar4 = sVar3;
  }
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)&this->m_first,
             (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,value->_M_str,value->_M_str + uVar4);
  cVar1 = value->_M_str[sVar3];
  if (cVar1 == '%') {
    pcVar2 = (first->_M_dataplus)._M_p;
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              ((vector<char,std::allocator<char>> *)&this->m_first,
               (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,pcVar2,pcVar2 + first->_M_string_length);
  }
  else {
    if (cVar1 == '^') {
      if (sVar3 == value->_M_len - 1) {
        __assert_fail("offset != value.size() - 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                      ,0x12a,
                      "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = std::basic_string<char>, Rest = <std::basic_string<char>, std::basic_string<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>>]"
                     );
      }
      write_impl(this,value->_M_str[sVar3 + 1]);
      uVar4 = sVar3 + 2;
      if (uVar4 <= value->_M_len) {
        local_40._M_str = value->_M_str + uVar4;
        local_40._M_len = value->_M_len - uVar4;
        write_segment<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (this,&local_40,first,rest,rest_1,rest_2,rest_3,rest_4);
        return;
      }
      goto LAB_001748b6;
    }
    local_40._M_str = (first->_M_dataplus)._M_p;
    local_40._M_len = first->_M_string_length;
    writer::write_code((writer *)this,&local_40);
  }
  uVar4 = sVar3 + 1;
  if (sVar3 < value->_M_len) {
    local_40._M_len = value->_M_len - uVar4;
    local_40._M_str = value->_M_str + uVar4;
    write_segment<std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (this,&local_40,rest,rest_1,rest_2,rest_3,rest_4);
    return;
  }
LAB_001748b6:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar4);
}

Assistant:

void write_segment(std::string_view const& value, First const& first, Rest const&... rest)
        {
            auto offset = value.find_first_of("^%@");
            assert(offset != std::string_view::npos);
            write(value.substr(0, offset));

            if (value[offset] == '^')
            {
                assert(offset != value.size() - 1);

                write(value[offset + 1]);
                write_segment(value.substr(offset + 2), first, rest...);
            }
            else
            {
                if (value[offset] == '%')
                {
                    static_cast<T*>(this)->write(first);
                }
                else
                {
                    if constexpr (std::is_convertible_v<First, std::string_view>)
                    {
                        static_cast<T*>(this)->write_code(first);
                    }
                    else
                    {
                        assert(false); // '@' placeholders are only for text.
                    }
                }

                write_segment(value.substr(offset + 1), rest...);
            }
        }